

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

bool __thiscall Ptex::v2_2::PtexReader::reopenFP(PtexReader *this)

{
  PtexInputHandler *pPVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 extraout_var;
  PtexReader *in_RDI;
  ExtHeader extheaderval;
  Header headerval;
  undefined1 local_78 [3];
  undefined1 in_stack_ffffffffffffff8b;
  int in_stack_ffffffffffffff8c;
  void *in_stack_ffffffffffffff90;
  PtexReader *in_stack_ffffffffffffff98;
  undefined1 local_50 [24];
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  PtexReader *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (in_RDI->_fp == (Handle)0x0) {
    pPVar1 = in_RDI->_io;
    uVar3 = std::__cxx11::string::c_str();
    iVar2 = (*pPVar1->_vptr_PtexInputHandler[2])(pPVar1,uVar3);
    in_RDI->_fp = (Handle)CONCAT44(extraout_var,iVar2);
    if (in_RDI->_fp == (Handle)0x0) {
      setError(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_1 = false;
    }
    else {
      in_RDI->_pos = 0;
      readBlock(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                (bool)in_stack_ffffffffffffff8b);
      memset(local_78,0,0x28);
      PtexUtils::min<unsigned_int>(0x28,in_stack_ffffffffffffffcc);
      readBlock(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                (bool)in_stack_ffffffffffffff8b);
      iVar2 = memcmp(local_50,&in_RDI->_header,0x40);
      if ((iVar2 == 0) && (iVar2 = memcmp(local_78,&in_RDI->_extheader,0x28), iVar2 == 0)) {
        logOpen(in_RDI);
        return true;
      }
      setError(in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PtexReader::reopenFP()
{
    if (_fp) return true;

    // we assume this is called lazily in a scope where readlock is already held
    _fp = _io->open(_path.c_str());
    if (!_fp) {
        setError("Can't reopen");
        return false;
    }
    _pos = 0;
    Header headerval;
    ExtHeader extheaderval;
    readBlock(&headerval, HeaderSize);
    memset(&extheaderval, 0, sizeof(extheaderval));
    readBlock(&extheaderval, PtexUtils::min(uint32_t(ExtHeaderSize), headerval.extheadersize));
    if (0 != memcmp(&headerval, &_header, sizeof(headerval)) ||
        0 != memcmp(&extheaderval, &_extheader, sizeof(extheaderval)))
    {
        setError("Header mismatch on reopen of");
        return false;
    }
    logOpen();
    return true;
}